

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall FixedElement::~FixedElement(FixedElement *this)

{
  this->_vptr_FixedElement = (_func_int **)&PTR___cxa_pure_virtual_0019d5b0;
  std::__cxx11::string::~string((string *)&this->gene_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&(this->interactions_)._M_t);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<FixedElement>)._M_weak_this.
              super___weak_ptr<FixedElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

FixedElement::~FixedElement(){}